

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operators.hpp
# Opt level: O0

void chaiscript::bootstrap::operators::logical_compliment<bool>(Module *m)

{
  allocator<char> local_49;
  string local_48;
  anon_class_1_0_00000001_for_m_f local_21;
  Proxy_Function local_20;
  Module *local_10;
  Module *m_local;
  
  local_10 = m;
  fun<chaiscript::bootstrap::operators::logical_compliment<bool>(chaiscript::Module&)::_lambda(bool_const&)_1_>
            ((chaiscript *)&local_20,&local_21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"!",&local_49);
  Module::add(m,&local_20,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_20);
  return;
}

Assistant:

void logical_compliment(Module &m) {
    m.add(chaiscript::fun([](const T &lhs) { return !lhs; }), "!");
  }